

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  size_t __n;
  size_t __n_00;
  int iVar1;
  ulong uVar2;
  json_t *json;
  void *pvVar3;
  json_t *pjVar4;
  char *pcVar5;
  json_error_code jVar6;
  
  uVar2 = lex->depth + 1;
  lex->depth = uVar2;
  if (0x800 < uVar2) {
    pcVar5 = "maximum parsing depth reached";
    jVar6 = json_error_stack_overflow;
    goto LAB_00118a71;
  }
  iVar1 = lex->token;
  if (iVar1 < 0x100) {
    if (iVar1 == -1) {
      pcVar5 = "invalid token";
    }
    else {
      if (iVar1 == 0x5b) {
        json = json_array();
        if (json == (json_t *)0x0) {
          return (json_t *)0x0;
        }
        lex_scan(lex,error);
        if (lex->token != 0) {
          if (lex->token == 0x5d) goto LAB_00118d05;
          do {
            pjVar4 = parse_value(lex,flags,error);
            if ((pjVar4 == (json_t *)0x0) ||
               (iVar1 = json_array_append_new(json,pjVar4), iVar1 != 0)) goto LAB_00118ccf;
            lex_scan(lex,error);
            if (lex->token != 0x2c) {
              if (lex->token == 0x5d) goto LAB_00118d00;
              break;
            }
            lex_scan(lex,error);
          } while (lex->token != 0);
        }
        pcVar5 = "\']\' expected";
LAB_00118cbd:
        jVar6 = json_error_invalid_syntax;
LAB_00118cc8:
        error_set(error,lex,jVar6,pcVar5);
LAB_00118ccf:
        json_delete(json);
        return (json_t *)0x0;
      }
      if (iVar1 == 0x7b) {
        json = json_object();
        if (json == (json_t *)0x0) {
          return (json_t *)0x0;
        }
        lex_scan(lex,error);
        if (lex->token != 0x7d) {
          if (lex->token == 0x100) {
            do {
              pcVar5 = (lex->value).string.val;
              __n_00 = (lex->value).string.len;
              (lex->value).string.val = (char *)0x0;
              (lex->value).string.len = 0;
              if (pcVar5 == (char *)0x0) {
                return (json_t *)0x0;
              }
              pvVar3 = memchr(pcVar5,0,__n_00);
              if (pvVar3 != (void *)0x0) {
                jsonp_free(pcVar5);
                pcVar5 = "NUL byte in object key not supported";
                jVar6 = json_error_null_byte_in_key;
                goto LAB_00118cc8;
              }
              if (((flags & 1) != 0) &&
                 (pjVar4 = json_object_getn(json,pcVar5,__n_00), pjVar4 != (json_t *)0x0)) {
                jsonp_free(pcVar5);
                pcVar5 = "duplicate object key";
                jVar6 = json_error_duplicate_key;
                goto LAB_00118cc8;
              }
              lex_scan(lex,error);
              if (lex->token != 0x3a) {
                jsonp_free(pcVar5);
                pcVar5 = "\':\' expected";
                goto LAB_00118cbd;
              }
              lex_scan(lex,error);
              pjVar4 = parse_value(lex,flags,error);
              if (pjVar4 == (json_t *)0x0) {
                jsonp_free(pcVar5);
                goto LAB_00118ccf;
              }
              iVar1 = json_object_setn_new_nocheck(json,pcVar5,__n_00,pjVar4);
              jsonp_free(pcVar5);
              if (iVar1 != 0) goto LAB_00118ccf;
              lex_scan(lex,error);
              if (lex->token != 0x2c) {
                if (lex->token == 0x7d) goto LAB_00118d00;
                pcVar5 = "\'}\' expected";
                goto LAB_00118cbd;
              }
              lex_scan(lex,error);
            } while (lex->token == 0x100);
          }
          pcVar5 = "string or \'}\' expected";
          goto LAB_00118cbd;
        }
        goto LAB_00118d05;
      }
switchD_00118aa7_default:
      pcVar5 = "unexpected token";
    }
    jVar6 = json_error_invalid_syntax;
LAB_00118a71:
    error_set(error,lex,jVar6,pcVar5);
    return (json_t *)0x0;
  }
  switch(iVar1) {
  case 0x100:
    pcVar5 = (lex->value).string.val;
    __n = (lex->value).string.len;
    if (((flags & 0x10) == 0) && (pvVar3 = memchr(pcVar5,0,__n), pvVar3 != (void *)0x0)) {
      pcVar5 = "\\u0000 is not allowed without JSON_ALLOW_NUL";
      jVar6 = json_error_null_character;
      goto LAB_00118a71;
    }
    json = jsonp_stringn_nocheck_own(pcVar5,__n);
    (lex->value).string.val = (char *)0x0;
    (lex->value).string.len = 0;
    break;
  case 0x101:
    json = json_integer((lex->value).integer);
    break;
  case 0x102:
    json = json_real((lex->value).real);
    break;
  case 0x103:
    json = json_true();
    break;
  case 0x104:
    json = json_false();
    break;
  case 0x105:
    json = json_null();
    break;
  default:
    goto switchD_00118aa7_default;
  }
LAB_00118d00:
  if (json == (json_t *)0x0) {
    return (json_t *)0x0;
  }
LAB_00118d05:
  lex->depth = lex->depth - 1;
  return json;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error) {
    json_t *json;

    lex->depth++;
    if (lex->depth > JSON_PARSER_MAX_DEPTH) {
        error_set(error, lex, json_error_stack_overflow, "maximum parsing depth reached");
        return NULL;
    }

    switch (lex->token) {
        case TOKEN_STRING: {
            const char *value = lex->value.string.val;
            size_t len = lex->value.string.len;

            if (!(flags & JSON_ALLOW_NUL)) {
                if (memchr(value, '\0', len)) {
                    error_set(error, lex, json_error_null_character,
                              "\\u0000 is not allowed without JSON_ALLOW_NUL");
                    return NULL;
                }
            }

            json = jsonp_stringn_nocheck_own(value, len);
            lex->value.string.val = NULL;
            lex->value.string.len = 0;
            break;
        }

        case TOKEN_INTEGER: {
            json = json_integer(lex->value.integer);
            break;
        }

        case TOKEN_REAL: {
            json = json_real(lex->value.real);
            break;
        }

        case TOKEN_TRUE:
            json = json_true();
            break;

        case TOKEN_FALSE:
            json = json_false();
            break;

        case TOKEN_NULL:
            json = json_null();
            break;

        case '{':
            json = parse_object(lex, flags, error);
            break;

        case '[':
            json = parse_array(lex, flags, error);
            break;

        case TOKEN_INVALID:
            error_set(error, lex, json_error_invalid_syntax, "invalid token");
            return NULL;

        default:
            error_set(error, lex, json_error_invalid_syntax, "unexpected token");
            return NULL;
    }

    if (!json)
        return NULL;

    lex->depth--;
    return json;
}